

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O3

int GetLatestDataMES(MES *pMES,double *pDistance)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  ulong __n;
  char *pcVar9;
  undefined1 *__buf;
  uint uVar10;
  char *pcVar11;
  char recvbuf [48];
  CHRONO chrono;
  char savebuf [24];
  timespec local_d8;
  undefined8 local_c8;
  undefined1 auStack_c0 [7];
  undefined1 uStack_b9;
  undefined7 uStack_b8;
  undefined1 uStack_b1;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  timespec local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_78;
  long lStack_70;
  timespec local_68;
  int local_58;
  double *local_50;
  undefined8 local_48;
  undefined7 uStack_40;
  undefined1 uStack_39;
  undefined7 uStack_38;
  undefined1 uStack_31;
  
  iVar2 = clock_getres(4,&local_68);
  if ((iVar2 == 0) && (iVar2 = clock_gettime(4,&local_98), iVar2 == 0)) {
    local_58 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    lStack_70 = 0;
  }
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_b8 = 0;
  uStack_b1 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  auStack_c0 = (undefined1  [7])0x0;
  uStack_b9 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_39 = 0;
  uStack_38 = 0;
  uStack_31 = 0;
  iVar2 = (pMES->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    uVar3 = recv((pMES->RS232Port).s,&local_c8,0x17,0);
LAB_001c1f12:
    uVar10 = (uint)uVar3;
    if (0 < (int)uVar10) {
      if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
        fwrite(&local_c8,uVar3 & 0xffffffff,1,(FILE *)pMES->pfSaveFile);
        fflush((FILE *)pMES->pfSaveFile);
      }
      if (0x16 < uVar10) {
        if (uVar10 == 0x17) {
          do {
            lVar8 = local_78;
            lVar5 = lStack_70;
            if (local_58 == 0) {
              clock_gettime(4,&local_d8);
              lVar8 = ((local_d8.tv_sec + local_78) - local_98.tv_sec) +
                      (local_d8.tv_nsec + lStack_70) / 1000000000;
              lVar5 = (local_d8.tv_nsec + lStack_70) % 1000000000 - local_98.tv_nsec;
              if (lVar5 < 0) {
                lVar8 = lVar8 + ~((ulong)-lVar5 / 1000000000);
                lVar5 = lVar5 + 1000000000 + ((ulong)-lVar5 / 1000000000) * 1000000000;
              }
            }
            if (4.0 < (double)lVar5 / 1000000000.0 + (double)lVar8) goto LAB_001c2378;
            uStack_38 = uStack_b8;
            local_48 = local_c8;
            uStack_40 = auStack_c0;
            uStack_39 = uStack_b9;
            iVar2 = (pMES->RS232Port).DevType;
            if (iVar2 - 1U < 4) {
              uVar3 = recv((pMES->RS232Port).s,&local_c8,0x17,0);
            }
            else {
              if (iVar2 != 0) goto LAB_001c2353;
              uVar3 = read(*(int *)&(pMES->RS232Port).hDev,&local_c8,0x17);
            }
            if ((int)uVar3 < 1) goto LAB_001c2353;
            if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
              fwrite(&local_c8,uVar3 & 0xffffffff,1,(FILE *)pMES->pfSaveFile);
              fflush((FILE *)pMES->pfSaveFile);
            }
          } while ((int)uVar3 == 0x17);
        }
        __n = uVar3 & 0xffffffff;
        memmove(&uStack_b1 + -__n,&local_c8,__n);
        memcpy(&local_c8,(void *)((long)&local_48 + __n),(long)(0x17 - (int)uVar3));
        uVar3 = 0x17;
      }
      pcVar9 = (char *)&local_c8;
      sVar4 = strlen(pcVar9);
      iVar2 = (int)sVar4 + 1;
      local_50 = pDistance;
      do {
        if (iVar2 == 0xb) {
          if (((pcVar9[7] == 'm') && (pcVar9[8] == '\r')) && (pcVar9[9] == '\n')) goto LAB_001c2156;
          break;
        }
        pcVar9 = pcVar9 + 1;
        iVar2 = iVar2 + -1;
      } while (10 < iVar2);
      do {
        lVar8 = local_78;
        lVar5 = lStack_70;
        if (local_58 == 0) {
          clock_gettime(4,&local_d8);
          lVar8 = ((local_d8.tv_sec + local_78) - local_98.tv_sec) +
                  (local_d8.tv_nsec + lStack_70) / 1000000000;
          lVar5 = (local_d8.tv_nsec + lStack_70) % 1000000000 - local_98.tv_nsec;
          if (lVar5 < 0) {
            lVar8 = lVar8 + ~((ulong)-lVar5 / 1000000000);
            lVar5 = lVar5 + 1000000000 + ((ulong)-lVar5 / 1000000000) * 1000000000;
          }
        }
        if (4.0 < (double)lVar5 / 1000000000.0 + (double)lVar8) {
LAB_001c2378:
          puts("Error reading data from a MES : Message timeout. ");
          return 2;
        }
        uVar10 = (uint)uVar3;
        if (0x2e < uVar10) {
          puts("Error reading data from a MES : Invalid data. ");
          return 4;
        }
        __buf = auStack_c0 + ((uVar3 & 0xffffffff) - 8);
        iVar2 = (pMES->RS232Port).DevType;
        if (iVar2 - 1U < 4) {
          uVar3 = recv((pMES->RS232Port).s,__buf,(ulong)(0x2f - uVar10),0);
        }
        else {
          if (iVar2 != 0) break;
          uVar3 = read(*(int *)&(pMES->RS232Port).hDev,__buf,(ulong)(0x2f - uVar10));
        }
        if ((int)uVar3 < 1) break;
        if ((pMES->bSaveRawData != 0) && ((FILE *)pMES->pfSaveFile != (FILE *)0x0)) {
          fwrite(__buf,uVar3 & 0xffffffff,1,(FILE *)pMES->pfSaveFile);
          fflush((FILE *)pMES->pfSaveFile);
        }
        uVar3 = (ulong)((int)uVar3 + uVar10);
        sVar4 = strlen((char *)&local_c8);
        iVar2 = (int)sVar4 + 1;
        pcVar9 = (char *)&local_c8;
        do {
          if (iVar2 == 0xb) {
            if (((pcVar9[7] == 'm') && (pcVar9[8] == '\r')) && (pcVar9[9] == '\n'))
            goto LAB_001c23ad;
            break;
          }
          pcVar9 = pcVar9 + 1;
          iVar2 = iVar2 + -1;
        } while (10 < iVar2);
      } while( true );
    }
  }
  else if (iVar2 == 0) {
    uVar3 = read(*(int *)&(pMES->RS232Port).hDev,&local_c8,0x17);
    goto LAB_001c1f12;
  }
LAB_001c2353:
  pcVar9 = "Error reading data from a MES. ";
  goto LAB_001c235a;
LAB_001c2156:
  do {
    pcVar11 = pcVar9;
    sVar4 = strlen(pcVar11 + 1);
    pcVar6 = pcVar11 + 10;
    iVar2 = (int)sVar4 + 1;
    while (iVar2 != 0xb) {
      pcVar6 = pcVar6 + 1;
      iVar2 = iVar2 + -1;
      if (iVar2 < 0xb) goto LAB_001c23d6;
    }
  } while (((pcVar6[-2] == 'm') && (pcVar6[-1] == '\r')) && (pcVar9 = pcVar6 + -9, *pcVar6 == '\n'))
  ;
  goto LAB_001c23d6;
LAB_001c23ad:
  do {
    pcVar11 = pcVar9;
    sVar4 = strlen(pcVar11 + 1);
    pcVar6 = pcVar11 + 10;
    iVar2 = (int)sVar4 + 1;
    while (iVar2 != 0xb) {
      pcVar6 = pcVar6 + 1;
      iVar2 = iVar2 + -1;
      if (iVar2 < 0xb) goto LAB_001c23d6;
    }
  } while (((pcVar6[-2] == 'm') && (pcVar6[-1] == '\r')) && (pcVar9 = pcVar6 + -9, *pcVar6 == '\n'))
  ;
LAB_001c23d6:
  pdVar1 = local_50;
  iVar7 = 0;
  iVar2 = __isoc99_sscanf(pcVar11,"%lfm\r\n",local_50);
  if (iVar2 == 1) {
    pMES->LastDistance = *pdVar1;
  }
  else {
    pcVar9 = "Error reading data from a MES : Invalid data. ";
LAB_001c235a:
    puts(pcVar9);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

inline int GetLatestDataMES(MES* pMES, double* pDistance)
{
	char recvbuf[2*MAX_NB_BYTES_MES];
	char savebuf[MAX_NB_BYTES_MES];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_MES-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MES. \n");
		return EXIT_FAILURE;
	}
	if ((pMES->bSaveRawData)&&(pMES->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
		fflush(pMES->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
			{
				printf("Error reading data from a MES : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a MES. \n");
				return EXIT_FAILURE;
			}
			if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pMES->pfSaveFile);
				fflush(pMES->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr = FindLatestMESMessage(recvbuf);

	while (!ptr)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_MES)
		{
			printf("Error reading data from a MES : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_MES-1)
		{
			printf("Error reading data from a MES : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pMES->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_MES-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MES. \n");
			return EXIT_FAILURE;
		}
		if ((pMES->bSaveRawData)&&(pMES->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pMES->pfSaveFile);
			fflush(pMES->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr = FindLatestMESMessage(recvbuf);
	}

	// Analyze data.

	if (sscanf(ptr, "%lfm\r\n", pDistance) != 1)
	{
		printf("Error reading data from a MES : Invalid data. \n");
		return EXIT_FAILURE;
	}

	pMES->LastDistance = *pDistance;

	return EXIT_SUCCESS;
}